

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Datetime.cpp
# Opt level: O1

bool __thiscall Datetime::parse_time_off_ext(Datetime *this,Pig *pig)

{
  bool bVar1;
  size_type previous;
  
  previous = Pig::cursor(pig);
  bVar1 = parse_time_ext(this,pig,false);
  if ((bVar1) && (bVar1 = parse_off_ext(this,pig), bVar1)) {
    return true;
  }
  Pig::restoreTo(pig,previous);
  return false;
}

Assistant:

bool Datetime::parse_time_off_ext (Pig& pig)
{
  auto checkpoint = pig.cursor ();

  if (parse_time_ext (pig, false) &&
      parse_off_ext (pig))
  {
    return true;
  }

  pig.restoreTo (checkpoint);
  return false;
}